

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall SolverTest_AddOption_Test::TestBody(SolverTest_AddOption_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  char *arg1;
  TestSolver *this_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  TestOption *opt;
  TestSolver s;
  pointer in_stack_fffffffffffffb48;
  ASLProblem *p;
  TestSolver *in_stack_fffffffffffffb50;
  undefined5 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5d;
  undefined1 in_stack_fffffffffffffb5e;
  undefined1 in_stack_fffffffffffffb5f;
  Args *in_stack_fffffffffffffb60;
  char *arg5;
  int line;
  char *arg4;
  undefined4 in_stack_fffffffffffffb78;
  Type type;
  TestSolver *in_stack_fffffffffffffb80;
  AssertHelper *this_01;
  CStringRef in_stack_fffffffffffffb88;
  CStringRef in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbc0;
  AssertionResult *in_stack_fffffffffffffbc8;
  AssertHelper *in_stack_fffffffffffffbd0;
  OptionPtr *in_stack_fffffffffffffbd8;
  SolverOptionManager *in_stack_fffffffffffffbe0;
  AssertionResult local_3d8 [2];
  char local_3b8 [8];
  char *local_3b0;
  BasicCStringRef<char> local_3a8;
  BasicCStringRef<char> local_3a0 [6];
  AssertHelper local_370 [110];
  
  fmt::BasicCStringRef<char>::BasicCStringRef(local_3a0,"testsolver");
  type = kSuccess;
  arg4 = (char *)0x0;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_3a8,(char *)0x0);
  TestSolver::TestSolver
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
             CONCAT44(type,in_stack_fffffffffffffb78),(int)((ulong)arg4 >> 0x20));
  local_3b0 = (char *)0x0;
  this_01 = local_370;
  arg1 = (char *)operator_new(0xd0);
  TestBody::TestOption::TestOption((TestOption *)in_stack_fffffffffffffb60);
  arg5 = local_3b8;
  local_3b0 = arg1;
  std::unique_ptr<mp::SolverOption,std::default_delete<mp::SolverOption>>::
  unique_ptr<std::default_delete<mp::SolverOption>,void>
            ((unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *)
             in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
  mp::SolverOptionManager::AddOption(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
  std::unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_>::~unique_ptr
            ((unique_ptr<mp::SolverOption,_std::default_delete<mp::SolverOption>_> *)
             in_stack_fffffffffffffb50);
  p = (ASLProblem *)0x0;
  Args::Args((Args *)in_stack_fffffffffffffb90.data_,arg1,(char *)this_01,
             (char *)CONCAT44(type,in_stack_fffffffffffffb78),arg4,arg5,
             (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  this_00 = (TestSolver *)Args::operator_cast_to_char___(in_stack_fffffffffffffb60);
  uVar1 = TestSolver::ParseOptions
                    (this_00,(char **)CONCAT17(in_stack_fffffffffffffb5f,
                                               CONCAT16(in_stack_fffffffffffffb5e,
                                                        CONCAT15(in_stack_fffffffffffffb5d,
                                                                 in_stack_fffffffffffffb58))),
                     (uint)((ulong)in_stack_fffffffffffffb50 >> 0x20),p);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffffb50,SUB81((ulong)p >> 0x38,0));
  Args::~Args((Args *)in_stack_fffffffffffffb50);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
               (char *)in_stack_fffffffffffffbb0.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,arg4,(int)((ulong)arg5 >> 0x20),(char *)this_00);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffbb8);
    testing::Message::~Message((Message *)0x13c9de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ca53);
  testing::internal::EqHelper<false>::Compare<int,int>
            (arg5,(char *)this_00,
             (int *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffb5d,
                                                           in_stack_fffffffffffffb58))),
             (int *)in_stack_fffffffffffffb50);
  line = (int)((ulong)arg5 >> 0x20);
  bVar3 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffba8);
  if (!bVar3) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffffb50 =
         (TestSolver *)testing::AssertionResult::failure_message((AssertionResult *)0x13cae9);
    testing::internal::AssertHelper::AssertHelper(this_01,type,arg4,line,(char *)this_00);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbd0,(Message *)in_stack_fffffffffffffbc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb50);
    testing::Message::~Message((Message *)0x13cb37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cb83);
  TestSolver::~TestSolver(in_stack_fffffffffffffb50);
  return;
}

Assistant:

TEST(SolverTest, AddOption) {
  struct TestOption : SolverOption {
    int value;
    TestOption() : SolverOption("testopt", "A test option."), value(0) {}

    void Write(fmt::Writer &) {}
    void Parse(const char *&s, bool=false) {
      char *end = 0;
      value = std::strtol(s, &end, 10);
      s = end;
    }
    virtual Option_Type type() { return BOOL; }
  };
  TestSolver s;
  TestOption *opt = 0;
  s.AddOption(SolverOptionPtr(opt = new TestOption()));
  EXPECT_TRUE(s.ParseOptions(Args("testopt=42"), Solver::NO_OPTION_ECHO));
  EXPECT_EQ(42, opt->value);
}